

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c
# Opt level: O0

void restore_metadata(file_stream *out,char *newpath,stat *stbuf)

{
  stat *in_RDX;
  file_stream *in_RSI;
  char *in_stack_00000018;
  file_stream *in_stack_00000020;
  
  restore_mode(in_RSI,in_RDX);
  restore_owner_and_group(in_RSI,in_RDX);
  restore_timestamps(in_stack_00000020,in_stack_00000018,(stat *)out);
  return;
}

Assistant:

static void
restore_metadata(struct file_stream *out, const tchar *newpath,
		 const stat_t *stbuf)
{
	restore_mode(out, stbuf);
	restore_owner_and_group(out, stbuf);
	restore_timestamps(out, newpath, stbuf);
}